

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

bool Fixpp::impl::
     doVisitField<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Re___14ul,15ul,16ul,17ul,18ul,19ul,20ul,21ul,22ul,23ul,24ul,25ul,26ul,27ul,28ul,29ul,30ul,31ul,32ul,33ul>
               (tuple<Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
                *message,uint tag,
               FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_7_>,_Fixpp::Required<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::TagT<3U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
               *visitor)

{
  type_by_index_t<0UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field;
  type_by_index_t<1UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_00;
  type_by_index_t<2UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_01;
  type_by_index_t<3UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_02;
  type_by_index_t<4UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_03;
  type_by_index_t<5UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_04;
  type_by_index_t<6UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_05;
  type_by_index_t<7UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_06;
  type_by_index_t<8UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_07;
  type_by_index_t<9UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_08;
  type_by_index_t<10UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_09;
  type_by_index_t<11UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_10;
  type_by_index_t<12UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_11;
  type_by_index_t<13UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_12;
  type_by_index_t<14UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_13;
  type_by_index_t<15UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_14;
  type_by_index_t<16UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_15;
  type_by_index_t<17UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_16;
  type_by_index_t<18UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_17;
  type_by_index_t<19UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_18;
  type_by_index_t<20UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_19;
  type_by_index_t<21UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_20;
  type_by_index_t<22UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_21;
  type_by_index_t<23UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_22;
  type_by_index_t<24UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_23;
  type_by_index_t<25UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_24;
  type_by_index_t<26UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_25;
  type_by_index_t<27UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_26;
  type_by_index_t<28UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_27;
  type_by_index_t<29UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_28;
  type_by_index_t<30UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_29;
  type_by_index_t<31UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_30;
  type_by_index_t<32UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_31;
  type_by_index_t<33UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<3U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<30U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *field_32;
  int dummy [35];
  int index;
  FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_7_>,_Fixpp::Required<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::TagT<3U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *visitor_local;
  uint tag_local;
  VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_7_>,_Fixpp::Required<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::TagT<3U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>_>
  *message_local;
  
  dummy[0x21] = -1;
  unique0x10000836 = visitor;
  field = meta::
          get<0ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                    (message);
  doVisitSingleField<0ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field,stack0xffffffffffffffd8,dummy + 0x21);
  field_00 = meta::
             get<1ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<1ul,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_00,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[0] = 0;
  field_01 = meta::
             get<2ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<2ul,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_01,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[1] = 0;
  field_02 = meta::
             get<3ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<3ul,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_02,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[2] = 0;
  field_03 = meta::
             get<4ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<4ul,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_03,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[3] = 0;
  field_04 = meta::
             get<5ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<5ul,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_04,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[4] = 0;
  field_05 = meta::
             get<6ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<6ul,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_05,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[5] = 0;
  field_06 = meta::
             get<7ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<7ul,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_06,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[6] = 0;
  field_07 = meta::
             get<8ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<8ul,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_07,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[7] = 0;
  field_08 = meta::
             get<9ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<9ul,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_08,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[8] = 0;
  field_09 = meta::
             get<10ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<10ul,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_09,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[9] = 0;
  field_10 = meta::
             get<11ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<11ul,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_10,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[10] = 0;
  field_11 = meta::
             get<12ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<12ul,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_11,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[0xb] = 0;
  field_12 = meta::
             get<13ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<13ul,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_12,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[0xc] = 0;
  field_13 = meta::
             get<14ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<14ul,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_13,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[0xd] = 0;
  field_14 = meta::
             get<15ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<15ul,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_14,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[0xe] = 0;
  field_15 = meta::
             get<16ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<16ul,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_15,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[0xf] = 0;
  field_16 = meta::
             get<17ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<17ul,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_16,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[0x10] = 0;
  field_17 = meta::
             get<18ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<18ul,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_17,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[0x11] = 0;
  field_18 = meta::
             get<19ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<19ul,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_18,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[0x12] = 0;
  field_19 = meta::
             get<20ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<20ul,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_19,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[0x13] = 0;
  field_20 = meta::
             get<21ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<21ul,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_20,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[0x14] = 0;
  field_21 = meta::
             get<22ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<22ul,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_21,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[0x15] = 0;
  field_22 = meta::
             get<23ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<23ul,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_22,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[0x16] = 0;
  field_23 = meta::
             get<24ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<24ul,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_23,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[0x17] = 0;
  field_24 = meta::
             get<25ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<25ul,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_24,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[0x18] = 0;
  field_25 = meta::
             get<26ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<26ul,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_25,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[0x19] = 0;
  field_26 = meta::
             get<27ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<27ul,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_26,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[0x1a] = 0;
  field_27 = meta::
             get<28ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<28ul,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_27,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[0x1b] = 0;
  field_28 = meta::
             get<29ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<29ul,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_28,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[0x1c] = 0;
  field_29 = meta::
             get<30ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<30ul,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_29,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[0x1d] = 0;
  field_30 = meta::
             get<31ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<31ul,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_30,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[0x1e] = 0;
  field_31 = meta::
             get<32ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<32ul,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_31,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[0x1f] = 0;
  field_32 = meta::
             get<33ul,Fixpp::FieldRef<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<3u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<149u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<30u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<33ul,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
            (tag,field_32,stack0xffffffffffffffd8,dummy + 0x21);
  dummy[0x20] = 0;
  if (dummy[0x21] != -1) {
    std::bitset<34UL>::set
              ((bitset<34UL> *)
               &message[1].base.
                super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_false>
                .value.m_view.second,(long)dummy[0x21],true);
  }
  return dummy[0x21] != -1;
}

Assistant:

bool doVisitField(Message& message, unsigned tag, Visitor& visitor,
                          meta::seq::index_sequence<Indexes...>)
        {
            int index = -1;
            int dummy[] = {0, (doVisitSingleField<Indexes>(tag, meta::get<Indexes>(message.values), visitor, &index), 0)...};

            (void) dummy;
            (void) tag;
            (void) visitor;

            if (index != -1)
                message.allBits.set(static_cast<size_t>(index));

            return index != -1;
        }